

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void DC8uvMode_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  long in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_stack_00000020;
  uint8_t *in_stack_00000028;
  uint8_t *in_stack_00000030;
  uint8_t *in_stack_00000038;
  
  if (in_RDX == 0) {
    if (in_RSI == (uint8_t *)0x0) {
      DC8uvNoTopLeft_SSE2((uint8_t *)0x16a0f9);
    }
    else {
      DC8uvNoTop_SSE2(in_RSI,(uint8_t *)0x0);
    }
  }
  else if (in_RSI == (uint8_t *)0x0) {
    DC8uvNoLeft_SSE2(in_stack_00000028,in_stack_00000020);
  }
  else {
    DC8uv_SSE2(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

static WEBP_INLINE void DC8uvMode_SSE2(uint8_t* WEBP_RESTRICT dst,
                                       const uint8_t* WEBP_RESTRICT left,
                                       const uint8_t* WEBP_RESTRICT top) {
  if (top != NULL) {
    if (left != NULL) {  // top and left present
      DC8uv_SSE2(dst, left, top);
    } else {  // top, but no left
      DC8uvNoLeft_SSE2(dst, top);
    }
  } else if (left != NULL) {  // left but no top
    DC8uvNoTop_SSE2(dst, left);
  } else {  // no top, no left, nothing.
    DC8uvNoTopLeft_SSE2(dst);
  }
}